

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_blend.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  int iVar4;
  undefined1 local_170 [8];
  BlendBenchWindow surface;
  SDLBackend backend;
  
  iVar4 = 0;
  do {
    if (argc <= iVar4) {
      rengine::SDLBackend::SDLBackend
                ((SDLBackend *)
                 &surface.m_pendingJobs.
                  super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
                  ._M_impl._M_node._M_size);
      BlendBenchWindow::BlendBenchWindow((BlendBenchWindow *)local_170);
      (**(code **)(*surface.super_StandardSurface.super_Surface._vptr_Surface + 0x18))();
      rengine::Backend::run
                ((Backend *)
                 &surface.m_pendingJobs.
                  super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
                  ._M_impl._M_node._M_size);
      BlendBenchWindow::~BlendBenchWindow((BlendBenchWindow *)local_170);
      rengine::SDLBackend::~SDLBackend
                ((SDLBackend *)
                 &surface.m_pendingJobs.
                  super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
                  ._M_impl._M_node._M_size);
      return 0;
    }
    std::__cxx11::string::string
              ((string *)local_170,argv[iVar4],
               (allocator *)
               &surface.m_pendingJobs.
                super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
                ._M_impl._M_node._M_size);
    iVar1 = iVar4 + 1;
    if (iVar1 < argc) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_170,"--count");
      if (!bVar2) goto LAB_001170f5;
      nodeCount = atoi(argv[iVar1]);
      iVar4 = iVar4 + 2;
    }
    else {
LAB_001170f5:
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_170,"--textures");
      iVar4 = iVar1;
      if (bVar2) {
        useTextures = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_170,"-h");
        if (!bVar2) {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_170,"--help");
          if (!bVar2) goto LAB_001171d7;
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<(poVar3," > ");
        poVar3 = std::operator<<(poVar3,*argv);
        poVar3 = std::operator<<(poVar3," [options]");
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<(poVar3,"Options:");
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<(poVar3,"  --count [x]      Number of layers");
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<(poVar3,"  --textures       Use textures rather than solid fills");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
LAB_001171d7:
    std::__cxx11::string::~string((string *)local_170);
  } while( true );
}

Assistant:

RENGINE_DEFINE_GLOBALS

int main(int argc, char **argv) {

    for (int i=0; i<argc; ++i) {
        std::string arg(argv[i]);
        if (i + 1 < argc && arg == "--count") {
            nodeCount = atoi(argv[++i]);
        } else if (arg == "--textures") {
            useTextures = true;
        } else if (arg == "-h" || arg == "--help") {
            cout << "Usage: " << endl
                 << " > " << argv[0] << " [options]" << endl
                 << endl
                 << "Options:" << endl
                 << "  --count [x]      Number of layers" << endl
                 << "  --textures       Use textures rather than solid fills" << endl;
        }
    }

    RENGINE_BACKEND backend;

    BlendBenchWindow surface;
    surface.show();

    backend.run();

    return 0;
}